

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_linear_workflow.cpp
# Opt level: O1

void __thiscall
ON_LinearWorkflow::ApplyPreProcessGamma(ON_LinearWorkflow *this,ON_4fColor *col,bool for_texture)

{
  char cVar1;
  float *pfVar2;
  uint bCondition;
  float __y;
  float fVar3;
  
  cVar1 = (**(code **)((long)this->_vptr_ON_LinearWorkflow + (ulong)((for_texture ^ 1) << 4) + 0x28)
          )();
  if (cVar1 != '\0') {
    (*this->_vptr_ON_LinearWorkflow[0xd])(this);
    if (1e-06 <= ABS(__y + -1.0)) {
      pfVar2 = ON_4fColor::FloatArray(col);
      bCondition = 0;
      if ((0.0 <= *pfVar2) && (0.0 <= pfVar2[1])) {
        bCondition = (uint)(0.0 <= pfVar2[2]);
      }
      ON_REMOVE_ASAP_AssertEx
                (bCondition,
                 "/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_linear_workflow.cpp"
                 ,0xb6,"","(f[0] >= 0.0) && (f[1] >= 0.0) && (f[2] >= 0.0) is false");
      if (0.0 < *pfVar2) {
        fVar3 = powf(*pfVar2,__y);
        *pfVar2 = fVar3;
      }
      if (0.0 < pfVar2[1]) {
        fVar3 = powf(pfVar2[1],__y);
        pfVar2[1] = fVar3;
      }
      if (0.0 < pfVar2[2]) {
        fVar3 = powf(pfVar2[2],__y);
        pfVar2[2] = fVar3;
      }
    }
  }
  return;
}

Assistant:

void ON_LinearWorkflow::ApplyPreProcessGamma(ON_4fColor& col, bool for_texture) const
{
  const bool check = for_texture ? PreProcessTexturesOn() : PreProcessColorsOn();
  if (!check)
    return;

  const float gamma = PreProcessGamma();
  if (!IsFloatEqual(gamma, 1.0f))
  {
    float* f = col.FloatArray();

    ON_ASSERT((f[0] >= 0.0) && (f[1] >= 0.0) && (f[2] >= 0.0));

    if (f[0] > 0.0) f[0] = powf(f[0], gamma);
    if (f[1] > 0.0) f[1] = powf(f[1], gamma);
    if (f[2] > 0.0) f[2] = powf(f[2], gamma);
  }
}